

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_namer.h
# Opt level: O1

string * __thiscall
flatbuffers::IdlNamer::LegacyRustNativeVariant_abi_cxx11_
          (string *__return_storage_ptr__,IdlNamer *this,EnumVal *v)

{
  string local_30;
  
  (*(this->super_Namer)._vptr_Namer[0xe])(&local_30);
  ConvertCase(__return_storage_ptr__,&local_30,kUpperCamel,kSnake);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LegacyRustNativeVariant(const EnumVal &v) const {
    return ConvertCase(EscapeKeyword(v.name), Case::kUpperCamel);
  }